

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

UtxoData * __thiscall cfd::UtxoData::operator=(UtxoData *this,UtxoData *object)

{
  if (this != object) {
    this->block_height = object->block_height;
    core::BlockHash::operator=(&this->block_hash,&object->block_hash);
    core::Txid::operator=(&this->txid,&object->txid);
    this->vout = object->vout;
    core::Script::operator=(&this->locking_script,&object->locking_script);
    core::Script::operator=(&this->redeem_script,&object->redeem_script);
    core::Address::operator=(&this->address,&object->address);
    std::__cxx11::string::_M_assign((string *)&this->descriptor);
    (this->amount).ignore_check_ = (object->amount).ignore_check_;
    (this->amount).amount_ = (object->amount).amount_;
    this->address_type = object->address_type;
    this->binary_data = object->binary_data;
    core::ConfidentialAssetId::operator=(&this->asset,&object->asset);
    core::ElementsConfidentialAddress::operator=
              (&this->confidential_address,&object->confidential_address);
    core::BlindFactor::operator=(&this->asset_blind_factor,&object->asset_blind_factor);
    core::BlindFactor::operator=(&this->amount_blind_factor,&object->amount_blind_factor);
    core::ConfidentialValue::operator=(&this->value_commitment,&object->value_commitment);
    core::Script::operator=(&this->scriptsig_template,&object->scriptsig_template);
  }
  return this;
}

Assistant:

UtxoData& UtxoData::operator=(const UtxoData& object) & {
  if (this != &object) {
    block_height = object.block_height;
    block_hash = object.block_hash;
    txid = object.txid;
    vout = object.vout;
    locking_script = object.locking_script;
    redeem_script = object.redeem_script;
    address = object.address;
    descriptor = object.descriptor;
    amount = object.amount;
    address_type = object.address_type;
    binary_data = object.binary_data;
#ifndef CFD_DISABLE_ELEMENTS
    asset = object.asset;
    confidential_address = object.confidential_address;
    asset_blind_factor = object.asset_blind_factor;
    amount_blind_factor = object.amount_blind_factor;
    value_commitment = object.value_commitment;
#endif  // CFD_DISABLE_ELEMENTS
    scriptsig_template = object.scriptsig_template;
  }
  return *this;
}